

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O1

void * r2i_certpol(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *value)

{
  char *pcVar1;
  ASN1_STRING *str;
  OPENSSL_STACK *sk;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  OPENSSL_STACK *sk_00;
  OPENSSL_STACK *sk_01;
  size_t sVar6;
  undefined8 *puVar7;
  size_t sVar8;
  OPENSSL_STACK *sk_02;
  OPENSSL_STACK *pOVar9;
  ASN1_VALUE *pAVar10;
  size_t sVar11;
  ASN1_OBJECT *pAVar12;
  ASN1_IA5STRING *str_00;
  size_t sVar13;
  ASN1_VALUE *pAVar14;
  ASN1_VISIBLESTRING *str_01;
  size_t sVar15;
  ASN1_VALUE *pAVar16;
  OPENSSL_STACK *sk_03;
  void *pvVar17;
  ASN1_INTEGER *a;
  size_t sVar18;
  char cVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  ASN1_VALUE *local_90;
  
  sk_00 = OPENSSL_sk_new_null();
  if (sk_00 != (OPENSSL_STACK *)0x0) {
    sk_01 = (OPENSSL_STACK *)X509V3_parse_list(value);
    if (sk_01 == (OPENSSL_STACK *)0x0) {
      ERR_put_error(0x14,0,0x14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                    ,0x7c);
    }
    else {
      sVar6 = OPENSSL_sk_num(sk_01);
      if (sVar6 != 0) {
        bVar4 = false;
        sVar6 = 0;
        do {
          puVar7 = (undefined8 *)OPENSSL_sk_value(sk_01,sVar6);
          if ((puVar7[2] == 0) && (pcVar1 = (char *)puVar7[1], pcVar1 != (char *)0x0)) {
            iVar5 = strcmp(pcVar1,"ia5org");
            if (iVar5 == 0) {
              cVar19 = '\x05';
              bVar4 = true;
            }
            else {
              if (*pcVar1 == '@') {
                sk_02 = (OPENSSL_STACK *)X509V3_get_section((X509V3_CTX *)ctx,pcVar1 + 1);
                if (sk_02 == (OPENSSL_STACK *)0x0) {
                  iVar5 = 0x86;
                  iVar20 = 0x8f;
LAB_004aed13:
                  bVar22 = false;
                  ERR_put_error(0x14,0,iVar5,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                ,iVar20);
                  ERR_add_error_data(6,"section:",*puVar7,",name:",puVar7[1],",value:",puVar7[2]);
                  cVar19 = '\x02';
                }
                else {
                  local_90 = ASN1_item_new((ASN1_ITEM *)&POLICYINFO_it);
                  if (local_90 == (ASN1_VALUE *)0x0) {
LAB_004aed9c:
                    ASN1_item_free(local_90,(ASN1_ITEM *)&POLICYINFO_it);
                    local_90 = (ASN1_VALUE *)0x0;
                  }
                  else {
                    sVar8 = OPENSSL_sk_num(sk_02);
                    if (sVar8 != 0) {
                      bVar22 = true;
                      sVar8 = 0;
                      do {
                        puVar7 = (undefined8 *)OPENSSL_sk_value(sk_02,sVar8);
                        pcVar1 = (char *)puVar7[1];
                        iVar5 = strcmp(pcVar1,"policyIdentifier");
                        if (iVar5 == 0) {
                          pAVar12 = OBJ_txt2obj((char *)puVar7[2],0);
                          bVar21 = pAVar12 == (ASN1_OBJECT *)0x0;
                          if (bVar21) {
                            ERR_put_error(0x14,0,0x81,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                          ,0xc2);
                            ERR_add_error_data(6,"section:",*puVar7,",name:",puVar7[1],",value:",
                                               puVar7[2]);
                          }
                          else {
                            *(ASN1_OBJECT **)local_90 = pAVar12;
                          }
                          bVar23 = pAVar12 == (ASN1_OBJECT *)0x0;
LAB_004aea5f:
                          if (!bVar23) {
                            bVar21 = false;
                          }
                        }
                        else {
                          iVar5 = x509v3_conf_name_matches(pcVar1,"CPS");
                          if (iVar5 == 0) {
                            iVar5 = x509v3_conf_name_matches((char *)puVar7[1],"userNotice");
                            if (iVar5 != 0) {
                              if (*(char *)puVar7[2] == '@') {
                                pOVar9 = (OPENSSL_STACK *)
                                         X509V3_get_section((X509V3_CTX *)ctx,(char *)puVar7[2] + 1)
                                ;
                                if (pOVar9 == (OPENSSL_STACK *)0x0) {
                                  bVar23 = false;
                                  ERR_put_error(0x14,0,0x86,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                ,0xe7);
                                  ERR_add_error_data(6,"section:",*puVar7,",name:",puVar7[1],
                                                     ",value:",puVar7[2]);
                                  bVar21 = true;
                                }
                                else {
                                  pAVar10 = ASN1_item_new((ASN1_ITEM *)&POLICYQUALINFO_it);
                                  if (pAVar10 == (ASN1_VALUE *)0x0) {
LAB_004aec34:
                                    ASN1_item_free(pAVar10,(ASN1_ITEM *)&POLICYQUALINFO_it);
                                    pAVar10 = (ASN1_VALUE *)0x0;
                                  }
                                  else {
                                    pAVar12 = OBJ_nid2obj(0xa5);
                                    *(ASN1_OBJECT **)pAVar10 = pAVar12;
                                    if (pAVar12 == (ASN1_OBJECT *)0x0) {
                                      iVar5 = 0x44;
                                      iVar20 = 0x112;
LAB_004aec2f:
                                      ERR_put_error(0x14,0,iVar5,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                  ,iVar20);
                                      goto LAB_004aec34;
                                    }
                                    pAVar14 = ASN1_item_new((ASN1_ITEM *)&USERNOTICE_it);
                                    if (pAVar14 == (ASN1_VALUE *)0x0) goto LAB_004aec34;
                                    *(ASN1_VALUE **)(pAVar10 + 8) = pAVar14;
                                    sVar11 = OPENSSL_sk_num(pOVar9);
                                    if (sVar11 != 0) {
                                      bVar21 = true;
                                      sVar11 = 0;
                                      do {
                                        puVar7 = (undefined8 *)OPENSSL_sk_value(pOVar9,sVar11);
                                        pcVar1 = (char *)puVar7[1];
                                        iVar5 = strcmp(pcVar1,"explicitText");
                                        if (iVar5 == 0) {
                                          str_01 = ASN1_VISIBLESTRING_new();
                                          *(ASN1_VISIBLESTRING **)(pAVar14 + 8) = str_01;
                                          bVar23 = true;
                                          if (str_01 != (ASN1_VISIBLESTRING *)0x0) {
                                            pcVar1 = (char *)puVar7[2];
                                            sVar13 = strlen(pcVar1);
                                            iVar5 = ASN1_STRING_set(str_01,pcVar1,(int)sVar13);
                                            if (iVar5 != 0) goto LAB_004ae7ae;
                                          }
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar1,"organization");
                                          if (iVar5 == 0) {
                                            pAVar16 = *(ASN1_VALUE **)pAVar14;
                                            if (pAVar16 == (ASN1_VALUE *)0x0) {
                                              pAVar16 = ASN1_item_new((ASN1_ITEM *)&NOTICEREF_it);
                                              if (pAVar16 != (ASN1_VALUE *)0x0) {
                                                *(ASN1_VALUE **)pAVar14 = pAVar16;
                                                goto LAB_004ae80c;
                                              }
                                              bVar23 = true;
                                              bVar3 = false;
                                            }
                                            else {
LAB_004ae80c:
                                              str = *(ASN1_STRING **)pAVar16;
                                              str->type = (uint)!bVar4 * 4 + 0x16;
                                              pcVar1 = (char *)puVar7[2];
                                              sVar13 = strlen(pcVar1);
                                              iVar5 = ASN1_STRING_set(str,pcVar1,(int)sVar13);
                                              bVar23 = iVar5 == 0;
                                              bVar3 = !bVar23;
                                            }
                                            if (!bVar3) goto LAB_004ae7b1;
                                          }
                                          else {
                                            iVar5 = strcmp(pcVar1,"noticeNumbers");
                                            if (iVar5 != 0) {
                                              ERR_put_error(0x14,0,0x82,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                  ,0x14e);
                                              ERR_add_error_data(6,"section:",*puVar7,",name:",
                                                                 puVar7[1],",value:",puVar7[2]);
                                              bVar23 = true;
                                              goto LAB_004ae7b1;
                                            }
                                            pAVar16 = *(ASN1_VALUE **)pAVar14;
                                            if (pAVar16 == (ASN1_VALUE *)0x0) {
                                              pAVar16 = ASN1_item_new((ASN1_ITEM *)&NOTICEREF_it);
                                              if (pAVar16 != (ASN1_VALUE *)0x0) {
                                                *(ASN1_VALUE **)pAVar14 = pAVar16;
                                                goto LAB_004ae880;
                                              }
LAB_004ae98e:
                                              bVar23 = true;
                                            }
                                            else {
LAB_004ae880:
                                              sk_03 = (OPENSSL_STACK *)
                                                      X509V3_parse_list((char *)puVar7[2]);
                                              if ((sk_03 == (OPENSSL_STACK *)0x0) ||
                                                 (sVar15 = OPENSSL_sk_num(sk_03), sVar15 == 0)) {
                                                ERR_put_error(0x14,0,0x80,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                  ,0x143);
                                                ERR_add_error_data(6,"section:",*puVar7,",name:",
                                                                   puVar7[1],",value:",puVar7[2]);
                                                OPENSSL_sk_pop_free_ex
                                                          (sk_03,sk_CONF_VALUE_call_free_func,
                                                           X509V3_conf_free);
                                                goto LAB_004ae98e;
                                              }
                                              sk = *(OPENSSL_STACK **)(pAVar16 + 8);
                                              sVar15 = OPENSSL_sk_num(sk_03);
                                              bVar23 = sVar15 == 0;
                                              if (!bVar23) {
                                                sVar15 = 0;
                                                do {
                                                  pvVar17 = OPENSSL_sk_value(sk_03,sVar15);
                                                  a = s2i_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,
                                                                       *(char **)((long)pvVar17 + 8)
                                                                      );
                                                  if (a == (ASN1_INTEGER *)0x0) {
                                                    ERR_put_error(0x14,0,0x7f,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                  ,0x167);
                                                  break;
                                                  }
                                                  sVar18 = OPENSSL_sk_push(sk,a);
                                                  if (sVar18 == 0) {
                                                    ASN1_INTEGER_free(a);
                                                    break;
                                                  }
                                                  sVar15 = sVar15 + 1;
                                                  sVar18 = OPENSSL_sk_num(sk_03);
                                                  bVar23 = sVar15 >= sVar18;
                                                } while (sVar15 < sVar18);
                                              }
                                              OPENSSL_sk_pop_free_ex
                                                        (sk_03,sk_CONF_VALUE_call_free_func,
                                                         X509V3_conf_free);
                                              bVar23 = (bool)(~bVar23 & 1);
                                            }
                                            if (bVar23) goto LAB_004ae7b1;
                                          }
LAB_004ae7ae:
                                          bVar23 = false;
                                        }
LAB_004ae7b1:
                                        if (bVar23) {
                                          if (bVar21) goto LAB_004aec34;
                                          break;
                                        }
                                        sVar11 = sVar11 + 1;
                                        sVar15 = OPENSSL_sk_num(pOVar9);
                                        bVar21 = sVar11 < sVar15;
                                      } while (bVar21);
                                    }
                                    plVar2 = *(long **)pAVar14;
                                    if ((plVar2 != (long *)0x0) &&
                                       ((plVar2[1] == 0 || (*plVar2 == 0)))) {
                                      iVar5 = 0x8a;
                                      iVar20 = 0x156;
                                      goto LAB_004aec2f;
                                    }
                                  }
                                  if (pAVar10 == (ASN1_VALUE *)0x0) {
                                    bVar21 = true;
                                    bVar23 = false;
                                  }
                                  else {
                                    if (*(long *)(local_90 + 8) == 0) {
                                      pOVar9 = OPENSSL_sk_new_null();
                                      *(OPENSSL_STACK **)(local_90 + 8) = pOVar9;
                                    }
                                    sVar11 = OPENSSL_sk_push(*(OPENSSL_STACK **)(local_90 + 8),
                                                             pAVar10);
                                    bVar21 = sVar11 == 0;
                                    bVar23 = !bVar21;
                                  }
                                }
                                bVar23 = !bVar23;
                                goto LAB_004aea5f;
                              }
                              ERR_put_error(0x14,0,0x6f,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                            ,0xe0);
                              ERR_add_error_data(6,"section:",*puVar7,",name:",puVar7[1],",value:",
                                                 puVar7[2]);
                              bVar21 = true;
                              goto LAB_004aeb4e;
                            }
                            ERR_put_error(0x14,0,0x82,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                          ,0xf6);
                            ERR_add_error_data(6,"section:",*puVar7,",name:",puVar7[1],",value:",
                                               puVar7[2]);
                          }
                          else {
                            if (*(long *)(local_90 + 8) == 0) {
                              pOVar9 = OPENSSL_sk_new_null();
                              *(OPENSSL_STACK **)(local_90 + 8) = pOVar9;
                            }
                            pAVar10 = ASN1_item_new((ASN1_ITEM *)&POLICYQUALINFO_it);
                            bVar21 = true;
                            if ((pAVar10 != (ASN1_VALUE *)0x0) &&
                               (sVar11 = OPENSSL_sk_push(*(OPENSSL_STACK **)(local_90 + 8),pAVar10),
                               sVar11 != 0)) {
                              pAVar12 = OBJ_nid2obj(0xa4);
                              *(ASN1_OBJECT **)pAVar10 = pAVar12;
                              if (pAVar12 == (ASN1_OBJECT *)0x0) {
                                ERR_put_error(0x14,0,0x44,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                              ,0xd4);
                              }
                              else {
                                str_00 = ASN1_IA5STRING_new();
                                *(ASN1_IA5STRING **)(pAVar10 + 8) = str_00;
                                if (str_00 != (ASN1_IA5STRING *)0x0) {
                                  pcVar1 = (char *)puVar7[2];
                                  sVar13 = strlen(pcVar1);
                                  iVar5 = ASN1_STRING_set(str_00,pcVar1,(int)sVar13);
                                  bVar23 = iVar5 == 0;
                                  goto LAB_004aea5f;
                                }
                              }
                            }
                          }
                          bVar21 = true;
                        }
LAB_004aeb4e:
                        if (bVar21) {
                          if (bVar22) goto LAB_004aed9c;
                          break;
                        }
                        sVar8 = sVar8 + 1;
                        sVar11 = OPENSSL_sk_num(sk_02);
                        bVar22 = sVar8 < sVar11;
                      } while (bVar22);
                    }
                    if (*(long *)local_90 == 0) {
                      ERR_put_error(0x14,0,0x8e,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                    ,0xfd);
                      goto LAB_004aed9c;
                    }
                  }
                  bVar22 = local_90 != (ASN1_VALUE *)0x0;
                  cVar19 = (local_90 == (ASN1_VALUE *)0x0) * '\x02';
                }
              }
              else {
                pAVar12 = OBJ_txt2obj(pcVar1,0);
                if (pAVar12 == (ASN1_OBJECT *)0x0) {
                  iVar5 = 0x81;
                  iVar20 = 0x9b;
                  goto LAB_004aed13;
                }
                local_90 = ASN1_item_new((ASN1_ITEM *)&POLICYINFO_it);
                if (local_90 == (ASN1_VALUE *)0x0) {
                  ASN1_OBJECT_free(pAVar12);
                  cVar19 = '\x02';
                  local_90 = (ASN1_VALUE *)0x0;
                  bVar22 = false;
                }
                else {
                  *(ASN1_OBJECT **)local_90 = pAVar12;
                  cVar19 = '\0';
                  bVar22 = true;
                }
              }
              if (bVar22) {
                sVar8 = OPENSSL_sk_push(sk_00,local_90);
                cVar19 = '\0';
                if (sVar8 == 0) {
                  ASN1_item_free(local_90,(ASN1_ITEM *)&POLICYINFO_it);
                  goto LAB_004ae41e;
                }
              }
            }
          }
          else {
            ERR_put_error(0x14,0,0x83,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                          ,0x83);
            ERR_add_error_data(6,"section:",*puVar7,",name:",puVar7[1],",value:",puVar7[2]);
LAB_004ae41e:
            cVar19 = '\x02';
          }
          if ((cVar19 != '\x05') && (cVar19 != '\0')) goto LAB_004aee07;
          sVar6 = sVar6 + 1;
          sVar8 = OPENSSL_sk_num(sk_01);
        } while (sVar6 < sVar8);
      }
      cVar19 = '\x03';
LAB_004aee07:
      if (cVar19 == '\x03') {
        OPENSSL_sk_pop_free_ex(sk_01,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
        cVar19 = '\x01';
      }
      if (cVar19 != '\x02') {
        return sk_00;
      }
    }
    OPENSSL_sk_pop_free_ex(sk_01,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
    OPENSSL_sk_pop_free_ex(sk_00,sk_POLICYINFO_call_free_func,POLICYINFO_free);
  }
  return (void *)0x0;
}

Assistant:

static void *r2i_certpol(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                         const char *value) {
  STACK_OF(POLICYINFO) *pols = sk_POLICYINFO_new_null();
  if (pols == NULL) {
    return NULL;
  }
  STACK_OF(CONF_VALUE) *vals = X509V3_parse_list(value);

  {
    if (vals == NULL) {
      OPENSSL_PUT_ERROR(X509V3, ERR_R_X509V3_LIB);
      goto err;
    }
    int ia5org = 0;
    for (size_t i = 0; i < sk_CONF_VALUE_num(vals); i++) {
      const CONF_VALUE *cnf = sk_CONF_VALUE_value(vals, i);
      if (cnf->value || !cnf->name) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_POLICY_IDENTIFIER);
        X509V3_conf_err(cnf);
        goto err;
      }
      POLICYINFO *pol;
      const char *pstr = cnf->name;
      if (!strcmp(pstr, "ia5org")) {
        ia5org = 1;
        continue;
      } else if (*pstr == '@') {
        const STACK_OF(CONF_VALUE) *polsect = X509V3_get_section(ctx, pstr + 1);
        if (!polsect) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SECTION);

          X509V3_conf_err(cnf);
          goto err;
        }
        pol = policy_section(ctx, polsect, ia5org);
        if (!pol) {
          goto err;
        }
      } else {
        ASN1_OBJECT *pobj = OBJ_txt2obj(cnf->name, 0);
        if (pobj == NULL) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
          X509V3_conf_err(cnf);
          goto err;
        }
        pol = POLICYINFO_new();
        if (pol == NULL) {
          ASN1_OBJECT_free(pobj);
          goto err;
        }
        pol->policyid = pobj;
      }
      if (!sk_POLICYINFO_push(pols, pol)) {
        POLICYINFO_free(pol);
        goto err;
      }
    }
    sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
    return pols;
  }

err:
  sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
  sk_POLICYINFO_pop_free(pols, POLICYINFO_free);
  return NULL;
}